

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O3

png_fixed_point
png_get_pixel_aspect_ratio_fixed(png_const_structrp png_ptr,png_const_inforp info_ptr)

{
  png_uint_32 divisor;
  int iVar1;
  undefined8 in_RAX;
  png_fixed_point res;
  png_fixed_point local_4;
  
  local_4 = (png_fixed_point)((ulong)in_RAX >> 0x20);
  if ((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
     ((info_ptr->valid & 0x80) != 0)) {
    divisor = info_ptr->x_pixels_per_unit;
    if ((divisor != 0) &&
       ((0 < (int)info_ptr->y_pixels_per_unit && -1 < (int)divisor &&
        (iVar1 = png_muldiv(&local_4,info_ptr->y_pixels_per_unit,100000,divisor), iVar1 != 0)))) {
      return local_4;
    }
  }
  return 0;
}

Assistant:

png_fixed_point PNGAPI
png_get_pixel_aspect_ratio_fixed(png_const_structrp png_ptr,
    png_const_inforp info_ptr)
{
#ifdef PNG_READ_pHYs_SUPPORTED
   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_pHYs) != 0 &&
       info_ptr->x_pixels_per_unit > 0 && info_ptr->y_pixels_per_unit > 0 &&
       info_ptr->x_pixels_per_unit <= PNG_UINT_31_MAX &&
       info_ptr->y_pixels_per_unit <= PNG_UINT_31_MAX)
   {
      png_fixed_point res;

      png_debug1(1, "in %s retrieval function", "png_get_aspect_ratio_fixed");

      /* The following casts work because a PNG 4 byte integer only has a valid
       * range of 0..2^31-1; otherwise the cast might overflow.
       */
      if (png_muldiv(&res, (png_int_32)info_ptr->y_pixels_per_unit, PNG_FP_1,
          (png_int_32)info_ptr->x_pixels_per_unit) != 0)
         return res;
   }
#else
   PNG_UNUSED(png_ptr)
   PNG_UNUSED(info_ptr)
#endif

   return 0;
}